

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O2

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MPoly>
          (Structure *this,MPoly *dest,FileDatabase *db)

{
  ReadField<1,int>(this,&dest->loopstart,"loopstart",db);
  ReadField<1,int>(this,&dest->totloop,"totloop",db);
  ReadField<1,short>(this,&dest->mat_nr,"mat_nr",db);
  ReadField<1,char>(this,&dest->flag,"flag",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<MPoly> (
    MPoly& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Igno>(dest.loopstart,"loopstart",db);
    ReadField<ErrorPolicy_Igno>(dest.totloop,"totloop",db);
    ReadField<ErrorPolicy_Igno>(dest.mat_nr,"mat_nr",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);

    db.reader->IncPtr(size);
}